

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *pXVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  XmlWriter *pXVar3;
  OfType OVar4;
  pointer pMVar5;
  pointer pcVar6;
  XmlReporter *this_00;
  int iVar7;
  byte bVar8;
  MessageInfo *msg;
  pointer pMVar9;
  ScopedElement scoped;
  ScopedElement scoped_2;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  XmlReporter *local_50;
  StringRef local_48;
  
  local_50 = this;
  iVar7 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  bVar8 = 1;
  if ((char)iVar7 == '\0') {
    bVar8 = ((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
            (byte)(char)(assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  if ((bVar8 != 0) || ((assertionStats->assertionResult).m_resultData.resultType == Warning)) {
    pMVar9 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar5 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar9 != pMVar5) {
      paVar2 = &local_b0.field_2;
      pXVar1 = &local_50->m_xml;
      do {
        if (pMVar9->type == Info && bVar8 == 1) {
          local_b0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Info","");
          local_90._0_8_ = pXVar1;
          XmlWriter::startElement(pXVar1,&local_b0);
          XmlWriter::writeText(pXVar1,&pMVar9->message,true);
LAB_001304b1:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        else if (pMVar9->type == Warning) {
          local_b0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Warning","");
          local_90._0_8_ = pXVar1;
          XmlWriter::startElement(pXVar1,&local_b0);
          XmlWriter::writeText(pXVar1,&pMVar9->message,true);
          goto LAB_001304b1;
        }
        pMVar9 = pMVar9 + 1;
      } while (pMVar9 != pMVar5);
    }
  }
  this_00 = local_50;
  if ((bVar8 | (assertionStats->assertionResult).m_resultData.resultType == Warning) != 1) {
    return true;
  }
  if (*(assertionStats->assertionResult).m_info.capturedExpression.m_start != '\0') {
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expression","");
    pXVar1 = &this_00->m_xml;
    XmlWriter::startElement(pXVar1,&local_b0);
    pXVar3 = (XmlWriter *)(local_90 + 0x10);
    local_90._0_8_ = pXVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"success","");
    XmlWriter::writeAttribute
              (pXVar1,(string *)local_90,
               ((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"type","");
    local_48.m_start = (assertionStats->assertionResult).m_info.macroName.m_start;
    local_48.m_size = (assertionStats->assertionResult).m_info.macroName.m_size;
    local_48.m_data = (char *)0x0;
    XmlWriter::writeAttribute<Catch::StringRef>(pXVar1,&local_70,&local_48);
    if (local_48.m_data != (char *)0x0) {
      operator_delete__(local_48.m_data);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((XmlWriter *)local_90._0_8_ != pXVar3) {
      operator_delete((void *)local_90._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_00,(SourceLineInfo *)&local_b0);
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Original","");
    local_70._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
    XmlWriter::startElement(pXVar1,&local_b0);
    AssertionResult::getExpression_abi_cxx11_((string *)local_90,&assertionStats->assertionResult);
    XmlWriter::writeText(pXVar1,(string *)local_90,true);
    if ((XmlWriter *)local_90._0_8_ != pXVar3) {
      operator_delete((void *)local_90._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expanded","");
    local_70._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
    XmlWriter::startElement(pXVar1,&local_b0);
    AssertionResult::getExpandedExpression_abi_cxx11_
              ((string *)local_90,&assertionStats->assertionResult);
    XmlWriter::writeText(pXVar1,(string *)local_90,true);
    if ((XmlWriter *)local_90._0_8_ != pXVar3) {
      operator_delete((void *)local_90._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  OVar4 = (assertionStats->assertionResult).m_resultData.resultType;
  if (OVar4 < ThrewException) {
    if (OVar4 == Info) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Info","");
      pXVar1 = &this_00->m_xml;
      local_70._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
      XmlWriter::startElement(pXVar1,&local_b0);
      pcVar6 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_90._0_8_ = (XmlWriter *)(local_90 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText(pXVar1,(string *)local_90,true);
      if ((XmlWriter *)local_90._0_8_ != (XmlWriter *)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      goto LAB_001309c3;
    }
    if (OVar4 != ExplicitFailure) goto LAB_001309c3;
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Failure","");
    XmlWriter::startElement(&this_00->m_xml,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_00,(SourceLineInfo *)&local_b0);
    pcVar6 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar6,
               pcVar6 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText(&this_00->m_xml,&local_b0,true);
  }
  else if (OVar4 == FatalErrorCondition) {
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"FatalErrorCondition","");
    XmlWriter::startElement(&this_00->m_xml,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_00,(SourceLineInfo *)&local_b0);
    pcVar6 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar6,
               pcVar6 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText(&this_00->m_xml,&local_b0,true);
  }
  else {
    if (OVar4 != ThrewException) goto LAB_001309c3;
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Exception","");
    XmlWriter::startElement(&this_00->m_xml,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_00,(SourceLineInfo *)&local_b0);
    pcVar6 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar6,
               pcVar6 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText(&this_00->m_xml,&local_b0,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  XmlWriter::endElement(&this_00->m_xml);
LAB_001309c3:
  if (*(assertionStats->assertionResult).m_info.capturedExpression.m_start != '\0') {
    XmlWriter::endElement(&this_00->m_xml);
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }